

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

int google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
              (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint32 uVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  uint64 uVar11;
  uint uVar12;
  string scratch;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  plVar9 = (long *)CONCAT44(extraout_var,iVar2);
  if (*(int *)(field + 0x30) == 3) {
    uVar3 = (**(code **)(*plVar9 + 0x30))();
  }
  else {
    bVar1 = (**(code **)(*plVar9 + 0x28))(plVar9,message,field);
    uVar3 = (uint)bVar1;
  }
  uVar12 = 0;
  uVar10 = 0;
  switch(*(undefined4 *)(field + 0x2c)) {
  case 1:
  case 6:
  case 0x10:
    uVar10 = uVar3 << 3;
    break;
  case 2:
  case 7:
  case 0xf:
    uVar10 = uVar3 << 2;
    break;
  case 3:
    if (*(int *)(field + 0x30) != 3) {
      uVar11 = (**(code **)(*plVar9 + 0x70))(plVar9,message,field);
LAB_001b81d9:
      iVar2 = io::CodedOutputStream::VarintSize64(uVar11);
      return iVar2;
    }
    uVar10 = uVar12;
    if (0 < (int)uVar3) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        uVar11 = (**(code **)(*plVar9 + 0x120))(plVar9,message,field,uVar12);
        iVar2 = io::CodedOutputStream::VarintSize64(uVar11);
        uVar10 = uVar10 + iVar2;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
    break;
  case 4:
    if (*(int *)(field + 0x30) != 3) {
      uVar11 = (**(code **)(*plVar9 + 0x80))(plVar9,message,field);
      goto LAB_001b81d9;
    }
    uVar10 = uVar12;
    if (0 < (int)uVar3) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        uVar11 = (**(code **)(*plVar9 + 0x130))(plVar9,message,field,uVar12);
        iVar2 = io::CodedOutputStream::VarintSize64(uVar11);
        uVar10 = uVar10 + iVar2;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
    break;
  case 5:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar10 = 0;
      do {
        uVar5 = (**(code **)(*plVar9 + 0x118))(plVar9,message,field,uVar10);
        if ((int)uVar5 < 0) {
          iVar4 = 10;
        }
        else {
          iVar4 = 1;
          if (0x7f < uVar5) {
            iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
          }
        }
        iVar2 = iVar2 + iVar4;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
      return iVar2;
    }
    uVar3 = (**(code **)(*plVar9 + 0x68))(plVar9,message,field);
    goto joined_r0x001b816d;
  case 8:
    uVar10 = uVar3;
    break;
  case 9:
  case 0xc:
    uVar10 = uVar12;
    if (0 < (int)uVar3) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        local_50 = &local_40;
        local_48 = 0;
        local_40 = 0;
        if (*(int *)(field + 0x30) == 3) {
          lVar7 = (**(code **)(*plVar9 + 0x168))(plVar9,message,field,uVar12,&local_50);
        }
        else {
          lVar7 = (**(code **)(*plVar9 + 0xb8))(plVar9,message,field,&local_50);
        }
        uVar6 = *(uint *)(lVar7 + 8);
        iVar2 = 1;
        if (0x7f < uVar6) {
          iVar2 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          uVar6 = *(uint *)(lVar7 + 8);
        }
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        uVar10 = uVar10 + iVar2 + uVar6;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
    break;
  case 10:
    if (*(int *)(field + 0x30) != 3) {
      plVar9 = (long *)(**(code **)(*plVar9 + 0xb0))(plVar9,message,field,0);
      iVar2 = (**(code **)(*plVar9 + 0x48))(plVar9);
      return iVar2;
    }
    uVar10 = uVar12;
    if (0 < (int)uVar3) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        plVar8 = (long *)(**(code **)(*plVar9 + 0x160))(plVar9,message,field,uVar12);
        iVar2 = (**(code **)(*plVar8 + 0x48))(plVar8);
        uVar10 = uVar10 + iVar2;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
    break;
  case 0xb:
    if (*(int *)(field + 0x30) == 3) {
      uVar10 = uVar12;
      if (0 < (int)uVar3) {
        uVar10 = 0;
        uVar12 = 0;
        do {
          plVar8 = (long *)(**(code **)(*plVar9 + 0x160))(plVar9,message,field,uVar12);
          uVar6 = (**(code **)(*plVar8 + 0x48))(plVar8);
          iVar2 = 1;
          if (0x7f < uVar6) {
            iVar2 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          }
          uVar10 = uVar10 + uVar6 + iVar2;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
    }
    else {
      plVar9 = (long *)(**(code **)(*plVar9 + 0xb0))(plVar9,message,field,0);
      uVar3 = (**(code **)(*plVar9 + 0x48))(plVar9);
      iVar2 = 1;
      if (0x7f < uVar3) {
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(uVar3);
      }
      uVar10 = iVar2 + uVar3;
    }
    break;
  case 0xd:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar10 = 0;
      do {
        uVar5 = (**(code **)(*plVar9 + 0x128))(plVar9,message,field,uVar10);
        iVar4 = 1;
        if (0x7f < uVar5) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        }
        iVar2 = iVar2 + iVar4;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
      return iVar2;
    }
    uVar3 = (**(code **)(*plVar9 + 0x78))(plVar9,message,field);
    goto joined_r0x001b817e;
  case 0xe:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar10 = 0;
      do {
        lVar7 = (**(code **)(*plVar9 + 0x158))(plVar9,message,field,uVar10);
        uVar12 = *(uint *)(lVar7 + 0x10);
        if ((int)uVar12 < 0) {
          iVar4 = 10;
        }
        else {
          iVar4 = 1;
          if (0x7f < uVar12) {
            iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar12);
          }
        }
        iVar2 = iVar2 + iVar4;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
      return iVar2;
    }
    lVar7 = (**(code **)(*plVar9 + 0xa8))(plVar9,message,field);
    uVar3 = *(uint *)(lVar7 + 0x10);
joined_r0x001b816d:
    if ((int)uVar3 < 0) {
      uVar10 = 10;
    }
    else {
joined_r0x001b817e:
      uVar10 = 1;
      if (0x7f < uVar3) {
LAB_001b8184:
        iVar2 = io::CodedOutputStream::VarintSize32Fallback(uVar3);
        return iVar2;
      }
    }
    break;
  case 0x11:
    if (*(int *)(field + 0x30) == 3) {
      if ((int)uVar3 < 1) {
        return 0;
      }
      iVar2 = 0;
      uVar10 = 0;
      do {
        iVar4 = (**(code **)(*plVar9 + 0x118))(plVar9,message,field,uVar10);
        uVar12 = iVar4 >> 0x1f ^ iVar4 * 2;
        iVar4 = 1;
        if (0x7f < uVar12) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar12);
        }
        iVar2 = iVar2 + iVar4;
        uVar10 = uVar10 + 1;
      } while (uVar3 != uVar10);
      return iVar2;
    }
    iVar2 = (**(code **)(*plVar9 + 0x68))(plVar9,message,field);
    uVar3 = iVar2 >> 0x1f ^ iVar2 * 2;
    if (uVar3 < 0x80) {
      return 1;
    }
    goto LAB_001b8184;
  case 0x12:
    if (*(int *)(field + 0x30) != 3) {
      lVar7 = (**(code **)(*plVar9 + 0x70))(plVar9,message,field);
      uVar11 = lVar7 * 2 ^ lVar7 >> 0x3f;
      goto LAB_001b81d9;
    }
    uVar10 = uVar12;
    if (0 < (int)uVar3) {
      uVar10 = 0;
      uVar12 = 0;
      do {
        lVar7 = (**(code **)(*plVar9 + 0x120))(plVar9,message,field,uVar12);
        iVar2 = io::CodedOutputStream::VarintSize64(lVar7 * 2 ^ lVar7 >> 0x3f);
        uVar10 = uVar10 + iVar2;
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
  }
  return uVar10;
}

Assistant:

int WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  int count = 0;
  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  int data_size = 0;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}